

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerPoll.cpp
# Opt level: O0

void __thiscall Liby::PollerPoll::PollerPoll(PollerPoll *this)

{
  PollerPoll *this_local;
  
  Poller::Poller(&this->super_Poller);
  (this->super_Poller)._vptr_Poller = (_func_int **)&PTR__PollerPoll_0018db28;
  std::vector<pollfd,_std::allocator<pollfd>_>::vector(&this->pollfds_);
  std::vector<pollfd,_std::allocator<pollfd>_>::resize(&this->pollfds_,0x30);
  return;
}

Assistant:

PollerPoll::PollerPoll() { pollfds_.resize(defaultPollSize); }